

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenuBar(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiWindow *unaff_retaddr;
  ImGuiNavLayer layer;
  ImGuiWindow *nav_earliest_child;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiScrollFlags in_stack_ffffffffffffffd8;
  ImGuiNavMoveFlags in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  uint clip_dir;
  ImGuiDir move_dir;
  ImGuiWindow *local_18;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    bVar2 = NavMoveRequestButNoResultYet();
    if ((bVar2) &&
       (((pIVar1->NavMoveDir == 0 || (pIVar1->NavMoveDir == 1)) &&
        ((pIVar1->NavWindow->Flags & 0x10000000U) != 0)))) {
      local_18 = pIVar1->NavWindow;
      while( true ) {
        clip_dir = in_stack_ffffffffffffffe0 & 0xffffff;
        if (local_18->ParentWindow != (ImGuiWindow *)0x0) {
          clip_dir = CONCAT13((local_18->ParentWindow->Flags & 0x10000000U) != 0,
                              (int3)in_stack_ffffffffffffffe0);
        }
        if ((char)(clip_dir >> 0x18) == '\0') break;
        local_18 = local_18->ParentWindow;
        in_stack_ffffffffffffffe0 = clip_dir;
      }
      if (((local_18->ParentWindow == pIVar3) && ((local_18->DC).ParentLayoutType == 0)) &&
         ((pIVar1->NavMoveFlags & 0x80U) == 0)) {
        move_dir = 1;
        FocusWindow(unaff_retaddr);
        SetNavID(pIVar3->NavLastIds[1],ImGuiNavLayer_Menu,0,pIVar3->NavRectRel + 1);
        pIVar1->NavDisableHighlight = true;
        pIVar1->NavMousePosDirty = true;
        pIVar1->NavDisableMouseHover = true;
        NavMoveRequestForward(move_dir,clip_dir,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
        ;
      }
    }
    PopClipRect();
    PopID();
    (pIVar3->DC).MenuBarOffset.x = (pIVar3->DC).CursorPos.x - (pIVar3->Pos).x;
    pIVar4 = ImVector<ImGuiGroupData>::back(&pIVar1->GroupStack);
    pIVar4->EmitItem = false;
    EndGroup();
    (pIVar3->DC).LayoutType = 1;
    (pIVar3->DC).IsSameLine = false;
    (pIVar3->DC).NavLayerCurrent = ImGuiNavLayer_Main;
    (pIVar3->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

void ImGui::EndMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Nav: When a move request within one of our child menu failed, capture the request to navigate among our siblings.
    if (NavMoveRequestButNoResultYet() && (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right) && (g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
    {
        // Try to find out if the request is for one of our child menu
        ImGuiWindow* nav_earliest_child = g.NavWindow;
        while (nav_earliest_child->ParentWindow && (nav_earliest_child->ParentWindow->Flags & ImGuiWindowFlags_ChildMenu))
            nav_earliest_child = nav_earliest_child->ParentWindow;
        if (nav_earliest_child->ParentWindow == window && nav_earliest_child->DC.ParentLayoutType == ImGuiLayoutType_Horizontal && (g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded) == 0)
        {
            // To do so we claim focus back, restore NavId and then process the movement request for yet another frame.
            // This involve a one-frame delay which isn't very problematic in this situation. We could remove it by scoring in advance for multiple window (probably not worth bothering)
            const ImGuiNavLayer layer = ImGuiNavLayer_Menu;
            IM_ASSERT(window->DC.NavLayersActiveMaskNext & (1 << layer)); // Sanity check (FIXME: Seems unnecessary)
            FocusWindow(window);
            SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
            g.NavDisableHighlight = true; // Hide highlight for the current frame so we don't see the intermediary selection.
            g.NavDisableMouseHover = g.NavMousePosDirty = true;
            NavMoveRequestForward(g.NavMoveDir, g.NavMoveClipDir, g.NavMoveFlags, g.NavMoveScrollFlags); // Repeat
        }
    }

    IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
    IM_ASSERT(window->Flags & ImGuiWindowFlags_MenuBar);
    IM_ASSERT(window->DC.MenuBarAppending);
    PopClipRect();
    PopID();
    window->DC.MenuBarOffset.x = window->DC.CursorPos.x - window->Pos.x; // Save horizontal position so next append can reuse it. This is kinda equivalent to a per-layer CursorPos.
    g.GroupStack.back().EmitItem = false;
    EndGroup(); // Restore position on layer 0
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    window->DC.IsSameLine = false;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.MenuBarAppending = false;
}